

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::CheckOpcode2(TypeChecker *this,Opcode opcode,Limits *limits)

{
  Type TVar1;
  Type expected2;
  Address AVar2;
  char *desc;
  Limits *limits_local;
  TypeChecker *this_local;
  Opcode opcode_local;
  Result result;
  
  this_local._0_4_ = opcode.enum_;
  TVar1 = Opcode::GetParamType1((Opcode *)&this_local);
  AVar2 = Opcode::GetMemorySize((Opcode *)&this_local);
  TVar1 = Opcode::GetMemoryParam((Opcode *)&this_local,TVar1,limits,AVar2 != 0);
  expected2 = Opcode::GetParamType2((Opcode *)&this_local);
  desc = Opcode::GetName((Opcode *)&this_local);
  this_local._4_4_ = PopAndCheck2Types(this,TVar1,expected2,desc);
  TVar1 = Opcode::GetResultType((Opcode *)&this_local);
  PushType(this,TVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckOpcode2(Opcode opcode, const Limits* limits) {
  Result result =
      PopAndCheck2Types(opcode.GetMemoryParam(opcode.GetParamType1(), limits,
                                              opcode.GetMemorySize() != 0),
                        opcode.GetParamType2(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}